

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflect.h
# Opt level: O1

void __thiscall
reflect::TypeDescriptor_Struct::dump(TypeDescriptor_Struct *this,void *obj,int indentLevel)

{
  char *pcVar1;
  int iVar2;
  char cVar3;
  size_t sVar4;
  ostream *poVar5;
  undefined4 in_register_00000014;
  pointer pMVar6;
  char *local_68;
  long local_60;
  char local_58 [16];
  undefined8 local_48;
  pointer local_40;
  void *local_38;
  
  local_48 = CONCAT44(in_register_00000014,indentLevel);
  pcVar1 = (this->super_TypeDescriptor).name;
  local_38 = obj;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1080b8);
  }
  else {
    sVar4 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  pMVar6 = (this->members).
           super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->members).
             super__Vector_base<reflect::TypeDescriptor_Struct::Member,_std::allocator<reflect::TypeDescriptor_Struct::Member>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pMVar6 != local_40) {
    iVar2 = (int)local_48;
    cVar3 = (char)local_48;
    do {
      local_68 = local_58;
      std::__cxx11::string::_M_construct((ulong)&local_68,cVar3 * '\x04' + '\x04');
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_68,local_60);
      pcVar1 = pMVar6->name;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      (*pMVar6->type->_vptr_TypeDescriptor[3])
                (pMVar6->type,pMVar6->offset + (long)local_38,(ulong)(iVar2 + 1));
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != local_40);
  }
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,(char)((int)local_48 << 2));
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

virtual void dump(const void* obj, int indentLevel) const override {
        std::cout << name << " {" << std::endl;
        for (const Member& member : members) {
            std::cout << std::string(4 * (indentLevel + 1), ' ') << member.name << " = ";
            member.type->dump((char*) obj + member.offset, indentLevel + 1);
            std::cout << std::endl;
        }
        std::cout << std::string(4 * indentLevel, ' ') << "}";
    }